

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O2

void __thiscall wasm::ImportInfo::ImportInfo(ImportInfo *this,Module *wasm)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  this->wasm = wasm;
  (this->importedGlobals).super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->importedGlobals).super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importedGlobals).super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->importedFunctions).super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->importedFunctions).super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importedFunctions).super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->importedMemories).super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->importedMemories).super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importedMemories).super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->importedTags).super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->importedTags).super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->importedTags).super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (wasm->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    local_38._M_head_impl =
         (Function *)
         (puVar6->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&((local_38._M_head_impl)->super_Importable).module + 8) != (char *)0x0) {
      std::vector<wasm::Global*,std::allocator<wasm::Global*>>::emplace_back<wasm::Global*>
                ((vector<wasm::Global*,std::allocator<wasm::Global*>> *)&this->importedGlobals,
                 (Global **)&local_38);
    }
  }
  puVar2 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    local_38._M_head_impl =
         (puVar7->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&((local_38._M_head_impl)->super_Importable).module + 8) != (char *)0x0) {
      std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&this->importedFunctions
                 ,&local_38._M_head_impl);
    }
  }
  puVar3 = (wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (wasm->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
    local_38._M_head_impl =
         (Function *)
         (puVar8->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&((local_38._M_head_impl)->super_Importable).module + 8) != (char *)0x0) {
      std::vector<wasm::Table*,std::allocator<wasm::Table*>>::emplace_back<wasm::Table*>
                ((vector<wasm::Table*,std::allocator<wasm::Table*>> *)&this->importedTables,
                 (Table **)&local_38);
    }
  }
  puVar4 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (wasm->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    local_38._M_head_impl =
         (Function *)
         (puVar9->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&((local_38._M_head_impl)->super_Importable).module + 8) != (char *)0x0) {
      std::vector<wasm::Memory*,std::allocator<wasm::Memory*>>::emplace_back<wasm::Memory*>
                ((vector<wasm::Memory*,std::allocator<wasm::Memory*>> *)&this->importedMemories,
                 (Memory **)&local_38);
    }
  }
  puVar5 = (wasm->tags).
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (wasm->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar5; puVar10 = puVar10 + 1
      ) {
    local_38._M_head_impl =
         (Function *)
         (puVar10->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
         super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    if (*(char **)((long)&((local_38._M_head_impl)->super_Importable).module + 8) != (char *)0x0) {
      std::vector<wasm::Tag*,std::allocator<wasm::Tag*>>::emplace_back<wasm::Tag*>
                ((vector<wasm::Tag*,std::allocator<wasm::Tag*>> *)&this->importedTags,
                 (Tag **)&local_38);
    }
  }
  return;
}

Assistant:

ImportInfo(Module& wasm) : wasm(wasm) {
    for (auto& import : wasm.globals) {
      if (import->imported()) {
        importedGlobals.push_back(import.get());
      }
    }
    for (auto& import : wasm.functions) {
      if (import->imported()) {
        importedFunctions.push_back(import.get());
      }
    }
    for (auto& import : wasm.tables) {
      if (import->imported()) {
        importedTables.push_back(import.get());
      }
    }
    for (auto& import : wasm.memories) {
      if (import->imported()) {
        importedMemories.push_back(import.get());
      }
    }
    for (auto& import : wasm.tags) {
      if (import->imported()) {
        importedTags.push_back(import.get());
      }
    }
  }